

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O1

void Shell::Shuffling::shuffleTwoList<unsigned_int,Kernel::TermList>
               (List<unsigned_int> **list1,List<Kernel::TermList> **list2)

{
  uint64_t uVar1;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *__s;
  List<unsigned_int> *pLVar2;
  List<unsigned_int> *pLVar3;
  List<Kernel::TermList> *pLVar4;
  ulong uVar5;
  uint uVar6;
  List<Kernel::TermList> *pLVar7;
  long lVar8;
  List<Kernel::TermList> **ppLVar9;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *res;
  uint uVar10;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> aux;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> local_60;
  List<unsigned_int> **local_48;
  List<Kernel::TermList> **local_40;
  long local_38;
  
  uVar10 = 0;
  for (pLVar2 = *list1; pLVar2 != (List<unsigned_int> *)0x0; pLVar2 = pLVar2->_tail) {
    uVar10 = uVar10 + 1;
  }
  if (1 < uVar10) {
    local_60._size = (size_t)uVar10;
    local_60._capacity = local_60._size;
    if (uVar10 == 2) {
      __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
            ::Lib::FixedSizeAllocator<32UL>::alloc
                      ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar10 < 4) {
      __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
            ::Lib::FixedSizeAllocator<48UL>::alloc
                      ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar10 == 4) {
      __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
            ::Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
            ::operator_new(local_60._size << 4,0x10);
    }
    if (local_60._capacity != 0) {
      memset(__s,0,local_60._capacity << 4);
    }
    pLVar2 = *list1;
    if (pLVar2 != (List<unsigned_int> *)0x0) {
      ppLVar9 = list2;
      uVar6 = 0;
      do {
        pLVar7 = *ppLVar9;
        __s[uVar6].first = pLVar2;
        __s[uVar6].second = pLVar7;
        ppLVar9 = &pLVar7->_tail;
        pLVar2 = pLVar2->_tail;
        uVar6 = uVar6 + 1;
      } while (pLVar2 != (List<unsigned_int> *)0x0);
    }
    local_60._array = __s;
    local_48 = list1;
    local_40 = list2;
    shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
              (&local_60,uVar10);
    local_38 = (ulong)(uVar10 + (uVar10 == 0)) << 4;
    lVar8 = 0;
    pLVar7 = (List<Kernel::TermList> *)0x0;
    pLVar2 = (List<unsigned_int> *)0x0;
    do {
      uVar10 = **(uint **)((long)&(local_60._array)->first + lVar8);
      pLVar3 = (List<unsigned_int> *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
      pLVar3->_head = uVar10;
      pLVar3->_tail = pLVar2;
      uVar1 = **(uint64_t **)((long)&(local_60._array)->second + lVar8);
      pLVar4 = (List<Kernel::TermList> *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
      (pLVar4->_head)._content = uVar1;
      pLVar4->_tail = pLVar7;
      lVar8 = lVar8 + 0x10;
      pLVar7 = pLVar4;
      pLVar2 = pLVar3;
    } while (local_38 != lVar8);
    *local_48 = pLVar3;
    *local_40 = pLVar4;
    if (local_60._array != (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)0x0) {
      uVar5 = local_60._capacity << 4;
      if (uVar5 == 0) {
        (local_60._array)->first = (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_
        ;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_60._array;
      }
      else if (uVar5 < 0x11) {
        (local_60._array)->first = (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_
        ;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_60._array;
      }
      else if (uVar5 < 0x19) {
        (local_60._array)->first = (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_
        ;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_60._array;
      }
      else if (uVar5 < 0x21) {
        (local_60._array)->first = (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_
        ;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_60._array;
      }
      else if (uVar5 < 0x31) {
        (local_60._array)->first =
             (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_60._array;
      }
      else if (uVar5 < 0x41) {
        (local_60._array)->first =
             (List<unsigned_int> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_60._array;
      }
      else {
        operator_delete(local_60._array,0x10);
      }
    }
  }
  return;
}

Assistant:

static void shuffleTwoList(List<T>*& list1, List<S>*& list2) {
    unsigned len = List<T>::length(list1);

    if (len <= 1) {
      return;
    }

    DArray<std::pair<List<T>*,List<S>*>> aux(len);
    unsigned idx = 0;

    List<T>* els1 = list1;
    List<S>* els2 = list2;
    while (els1 != nullptr) {
      ASS_NEQ(els2,0);
      aux[idx++] = std::make_pair(els1,els2);
      els1 = els1->tail();
      els2 = els2->tail();
    }
    ASS_EQ(els2,0);
    shuffleArray(aux,len);

    // create the new lists
    List<T>* res1 = nullptr;
    List<S>* res2 = nullptr;
    for(idx = 0; idx < len; idx++) {
      res1 = List<T>::cons(aux[idx].first->head(),res1);
      res2 = List<S>::cons(aux[idx].second->head(),res2);
    }

    // List<T>::destroy(list1);
    // List<S>::destroy(list2);

    list1 = res1;
    list2 = res2;
  }